

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

void gflags::anon_unknown_2::RegisterCommandLineFlag
               (char *name,char *help,char *filename,FlagValue *current,FlagValue *defvalue)

{
  Mutex *pMVar1;
  _Rb_tree_header *p_Var2;
  size_t *psVar3;
  ulong uVar4;
  key_type *__k;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Rb_tree_node_base *p_Var7;
  uint uVar8;
  int iVar9;
  _Base_ptr p_Var10;
  FlagRegistry *pFVar11;
  _Rb_tree_node_base *p_Var12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  _Base_ptr p_Var17;
  char *pcVar18;
  bool bVar19;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar20;
  
  p_Var17 = (_Base_ptr)0x151530;
  if (help != (char *)0x0) {
    p_Var17 = (_Base_ptr)help;
  }
  p_Var10 = (_Base_ptr)operator_new(0x38);
  *(char **)p_Var10 = name;
  p_Var10->_M_parent = p_Var17;
  p_Var10->_M_left = (_Base_ptr)filename;
  *(undefined1 *)&p_Var10->_M_right = 0;
  *(FlagValue **)(p_Var10 + 1) = defvalue;
  p_Var10[1]._M_parent = (_Base_ptr)current;
  p_Var10[1]._M_left = (_Base_ptr)0x0;
  pFVar11 = FlagRegistry::GlobalRegistry();
  pMVar1 = &pFVar11->lock_;
  iVar9 = pMVar1->mutex_;
  pMVar1->mutex_ = pMVar1->mutex_ + -1;
  if (iVar9 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  p_Var12 = (_Rb_tree_node_base *)operator_new(0x30);
  *(char **)(p_Var12 + 1) = name;
  p_Var12[1]._M_parent = p_Var10;
  p_Var2 = &(pFVar11->flags_)._M_t._M_impl.super__Rb_tree_header;
  p_Var17 = (pFVar11->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var14 = &p_Var2->_M_header;
  if (p_Var17 == (_Base_ptr)0x0) {
LAB_0013bea7:
    if (p_Var14 != (pFVar11->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      p_Var13 = (_Base_ptr)std::_Rb_tree_decrement(p_Var14);
      pcVar18 = *(char **)(p_Var13 + 1);
      goto LAB_0013bec0;
    }
LAB_0013bed3:
    if (p_Var2 == (_Rb_tree_header *)p_Var14) {
      bVar19 = true;
    }
    else {
      iVar9 = strcmp(name,*(char **)(p_Var14 + 1));
      bVar19 = SUB41((uint)iVar9 >> 0x1f,0);
    }
    std::_Rb_tree_insert_and_rebalance(bVar19,p_Var12,p_Var14,&p_Var2->_M_header);
    psVar3 = &(pFVar11->flags_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar3 = *psVar3 + 1;
  }
  else {
    do {
      p_Var13 = p_Var17;
      pcVar18 = *(char **)(p_Var13 + 1);
      uVar8 = strcmp(name,pcVar18);
      p_Var17 = (&p_Var13->_M_left)[~uVar8 >> 0x1f];
    } while ((&p_Var13->_M_left)[~uVar8 >> 0x1f] != (_Base_ptr)0x0);
    p_Var14 = p_Var13;
    if ((int)uVar8 < 0) goto LAB_0013bea7;
LAB_0013bec0:
    iVar9 = strcmp(pcVar18,name);
    if (iVar9 < 0) goto LAB_0013bed3;
    operator_delete(p_Var12);
    p_Var17 = (p_Var13[1]._M_parent)->_M_left;
    p_Var14 = p_Var10->_M_left;
    iVar9 = strcmp((char *)p_Var17,(char *)p_Var14);
    if (iVar9 == 0) {
      pcVar18 = 
      "ERROR: something wrong with flag \'%s\' in file \'%s\'.  One possibility: file \'%s\' is being linked both statically and dynamically into this executable.\n"
      ;
      p_Var17 = p_Var14;
    }
    else {
      pcVar18 = "ERROR: flag \'%s\' was defined more than once (in files \'%s\' and \'%s\').\n";
    }
    ReportError(DIE,pcVar18,*(undefined8 *)p_Var10,p_Var17,p_Var14);
  }
  p_Var17 = p_Var10[1]._M_parent;
  p_Var14 = (pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header;
  bVar19 = true;
  p_Var12 = &p_Var2->_M_header;
  if (p_Var14 != (_Base_ptr)0x0) {
    uVar4 = *(ulong *)p_Var17;
    do {
      if (*(ulong *)(p_Var14 + 1) >= uVar4) {
        p_Var12 = p_Var14;
      }
      p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < uVar4];
    } while (p_Var14 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var12 != p_Var2) {
      if (*(ulong *)(p_Var12 + 1) <= uVar4) goto LAB_0013c06e;
      bVar19 = false;
    }
  }
  p_Var15 = (_Rb_tree_node_base *)operator_new(0x30);
  __k = *(key_type **)p_Var17;
  *(key_type **)(p_Var15 + 1) = __k;
  p_Var15[1]._M_parent = (_Base_ptr)0x0;
  if (bVar19) {
    if (((pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (p_Var17 = (pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
       __k <= *(key_type **)(p_Var17 + 1))) {
LAB_0013c008:
      pVar20 = std::
               _Rb_tree<const_void_*,_std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
               ::_M_get_insert_unique_pos(&(pFVar11->flags_by_ptr_)._M_t,__k);
LAB_0013c015:
      p_Var12 = pVar20.first;
      if (pVar20.second == (_Rb_tree_node_base *)0x0) {
LAB_0013c037:
        operator_delete(p_Var15);
        goto LAB_0013c06e;
      }
    }
    else {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = p_Var17;
      pVar20 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar6 << 0x40);
    }
  }
  else if (__k < *(key_type **)(p_Var12 + 1)) {
    p_Var17 = (pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pVar20.second = p_Var17;
    pVar20.first = p_Var17;
    if (p_Var17 == p_Var12) goto LAB_0013c015;
    p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var12);
    if (__k <= *(key_type **)(p_Var16 + 1)) goto LAB_0013c008;
    p_Var7 = p_Var12;
    if (p_Var16->_M_right == (_Base_ptr)0x0) {
      p_Var12 = p_Var16;
      p_Var7 = (_Rb_tree_node_base *)0x0;
    }
    pVar20.second = p_Var12;
    pVar20.first = p_Var7;
  }
  else {
    if (__k <= *(key_type **)(p_Var12 + 1)) goto LAB_0013c037;
    p_Var17 = (pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    if (p_Var17 == p_Var12) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = p_Var17;
      pVar20 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar5 << 0x40);
      goto LAB_0013c015;
    }
    p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    if (*(key_type **)(p_Var16 + 1) <= __k) goto LAB_0013c008;
    p_Var7 = p_Var16;
    if (p_Var12->_M_right == (_Base_ptr)0x0) {
      p_Var16 = p_Var12;
      p_Var7 = (_Rb_tree_node_base *)0x0;
    }
    pVar20.second = p_Var16;
    pVar20.first = p_Var7;
  }
  p_Var12 = pVar20.second;
  bVar19 = true;
  if ((pVar20.first == (_Rb_tree_node_base *)0x0) && (p_Var2 != (_Rb_tree_header *)p_Var12)) {
    bVar19 = __k < *(key_type **)(p_Var12 + 1);
  }
  std::_Rb_tree_insert_and_rebalance(bVar19,p_Var15,p_Var12,&p_Var2->_M_header);
  psVar3 = &(pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar3 = *psVar3 + 1;
  p_Var12 = p_Var15;
LAB_0013c06e:
  p_Var12[1]._M_parent = p_Var10;
  pMVar1 = &pFVar11->lock_;
  pMVar1->mutex_ = pMVar1->mutex_ + 1;
  if (pMVar1->mutex_ == 0) {
    return;
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
}

Assistant:

void RegisterCommandLineFlag(const char* name,
                             const char* help,
                             const char* filename,
                             FlagValue* current,
                             FlagValue* defvalue) {
  if (help == NULL)
    help = "";
  // Importantly, flag_ will never be deleted, so storage is always good.
  CommandLineFlag* flag =
      new CommandLineFlag(name, help, filename, current, defvalue);
  FlagRegistry::GlobalRegistry()->RegisterFlag(flag);  // default registry
}